

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O3

REF_STATUS ref_list_deep_copy(REF_LIST *ref_list_ptr,REF_LIST original)

{
  uint uVar1;
  int iVar2;
  REF_INT *pRVar3;
  REF_LIST pRVar4;
  REF_INT *pRVar5;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  
  pRVar4 = (REF_LIST)malloc(0x10);
  *ref_list_ptr = pRVar4;
  if (pRVar4 == (REF_LIST)0x0) {
    pcVar8 = "malloc *ref_list_ptr of REF_LIST_STRUCT NULL";
    uVar6 = 0x36;
  }
  else {
    uVar1 = original->n;
    pRVar4->n = uVar1;
    iVar2 = original->max;
    pRVar4->max = iVar2;
    if ((long)iVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x3c,
             "ref_list_deep_copy","malloc ref_list->value of REF_INT negative");
      return 1;
    }
    pRVar5 = (REF_INT *)malloc((long)iVar2 << 2);
    pRVar4->value = pRVar5;
    if (pRVar5 != (REF_INT *)0x0) {
      if (0 < (int)uVar1) {
        pRVar3 = original->value;
        uVar7 = 0;
        do {
          pRVar5[uVar7] = pRVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
        return 0;
      }
      return 0;
    }
    pcVar8 = "malloc ref_list->value of REF_INT NULL";
    uVar6 = 0x3c;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",uVar6,
         "ref_list_deep_copy",pcVar8);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_list_deep_copy(REF_LIST *ref_list_ptr,
                                      REF_LIST original) {
  REF_LIST ref_list;
  REF_INT i;

  ref_malloc(*ref_list_ptr, 1, REF_LIST_STRUCT);
  ref_list = (*ref_list_ptr);

  ref_list_n(ref_list) = ref_list_n(original);
  ref_list_max(ref_list) = ref_list_max(original);

  ref_malloc(ref_list->value, ref_list_max(ref_list), REF_INT);
  for (i = 0; i < ref_list_n(ref_list); i++)
    ref_list->value[i] = original->value[i];

  return REF_SUCCESS;
}